

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O3

spvc_result
spvc_context_parse_spirv
          (spvc_context context,SpvId *spirv,size_t word_count,spvc_parsed_ir *parsed_ir)

{
  size_t sVar1;
  _Tuple_impl<0UL,_ScratchMemoryAllocation_*,_std::default_delete<ScratchMemoryAllocation>_> _Var2;
  spvc_result sVar3;
  Parser parser;
  undefined1 *local_898 [2];
  undefined1 local_888 [48];
  undefined1 local_858 [2088];
  
  _Var2.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl =
       (_Head_base<0UL,_ScratchMemoryAllocation_*,_false>)
       operator_new(0x790,(nothrow_t *)&std::nothrow);
  if (_Var2.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl ==
      (ScratchMemoryAllocation *)0x0) {
    local_898[0] = local_888;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_898,"Out of memory.","");
    std::__cxx11::string::operator=((string *)context,(string *)local_898);
    if (context->callback != (spvc_error_callback)0x0) {
      (*context->callback)(context->callback_userdata,(context->last_error)._M_dataplus._M_p);
    }
    sVar3 = SPVC_ERROR_OUT_OF_MEMORY;
    if (local_898[0] != local_888) {
      operator_delete(local_898[0]);
    }
  }
  else {
    *(undefined ***)_Var2.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl =
         &PTR__spvc_parsed_ir_s_004fa970;
    *(spvc_context *)
     ((long)_Var2.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 8) =
         (spvc_context)0x0;
    spirv_cross::ParsedIR::ParsedIR
              ((ParsedIR *)
               ((long)_Var2.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl +
               0x10U));
    *(spvc_context *)
     ((long)_Var2.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 8) =
         context;
    spirv_cross::Parser::Parser((Parser *)local_858,spirv,word_count);
    spirv_cross::Parser::parse((Parser *)local_858);
    spirv_cross::ParsedIR::operator=
              ((ParsedIR *)
               ((long)_Var2.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl +
               0x10U),(ParsedIR *)local_858);
    *parsed_ir = (spvc_parsed_ir)
                 _Var2.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl;
    spirv_cross::
    SmallVector<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>,_8UL>
    ::reserve(&context->allocations,
              (context->allocations).
              super_VectorView<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>_>
              .buffer_size + 1);
    sVar1 = (context->allocations).
            super_VectorView<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>_>
            .buffer_size;
    (context->allocations).
    super_VectorView<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>_>
    .ptr[sVar1]._M_t.
    super___uniq_ptr_impl<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>.
    _M_t.
    super__Tuple_impl<0UL,_ScratchMemoryAllocation_*,_std::default_delete<ScratchMemoryAllocation>_>
    .super__Head_base<0UL,_ScratchMemoryAllocation_*,_false> =
         _Var2.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl;
    (context->allocations).
    super_VectorView<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>_>
    .buffer_size = sVar1 + 1;
    local_858._2008_8_ = 0;
    if ((pair<unsigned_int,_unsigned_int> *)local_858._2000_8_ !=
        (pair<unsigned_int,_unsigned_int> *)(local_858 + 0x7e8)) {
      free((void *)local_858._2000_8_);
    }
    local_858._1952_8_ = 0;
    if ((undefined1 *)local_858._1944_8_ != local_858 + 0x7b0) {
      free((void *)local_858._1944_8_);
    }
    spirv_cross::ParsedIR::~ParsedIR((ParsedIR *)local_858);
    sVar3 = SPVC_SUCCESS;
  }
  return sVar3;
}

Assistant:

spvc_result spvc_context_parse_spirv(spvc_context context, const SpvId *spirv, size_t word_count,
                                     spvc_parsed_ir *parsed_ir)
{
	SPVC_BEGIN_SAFE_SCOPE
	{
		std::unique_ptr<spvc_parsed_ir_s> pir(new (std::nothrow) spvc_parsed_ir_s);
		if (!pir)
		{
			context->report_error("Out of memory.");
			return SPVC_ERROR_OUT_OF_MEMORY;
		}

		pir->context = context;
		Parser parser(spirv, word_count);
		parser.parse();
		pir->parsed = std::move(parser.get_parsed_ir());
		*parsed_ir = pir.get();
		context->allocations.push_back(std::move(pir));
	}